

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynSwitch * ParseSwitch(ParseContext *ctx)

{
  Lexeme *begin;
  Lexeme *pos;
  bool bVar1;
  SynSwitchCase *pSVar2;
  int iVar3;
  SynBase *this;
  undefined4 extraout_var;
  SynBase *this_00;
  Lexeme *pLVar4;
  undefined4 extraout_var_00;
  SynSwitchCase *pSVar5;
  SynSwitch *this_01;
  IntrusiveList<SynBase> IVar6;
  IntrusiveList<SynSwitchCase> cases;
  IntrusiveList<SynSwitchCase> local_48;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  begin = ctx->currentLexeme;
  if (begin->type != lex_switch) {
    return (SynSwitch *)0x0;
  }
  ctx->currentLexeme = begin + 1;
  anon_unknown.dwarf_169315::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'switch\'");
  this = ParseAssignment(ctx);
  if (this == (SynBase *)0x0) {
    anon_unknown.dwarf_169315::Report
              (ctx,ctx->currentLexeme,"ERROR: expression not found after \'switch(\'");
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
    this = (SynBase *)CONCAT44(extraout_var,iVar3);
    SynBase::SynBase(this,0,ctx->currentLexeme,ctx->currentLexeme);
    this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d30;
  }
  bVar1 = false;
  anon_unknown.dwarf_169315::CheckConsume
            (ctx,lex_cparen,
             "ERROR: closing \')\' not found after expression in \'switch\' statement");
  anon_unknown.dwarf_169315::CheckConsume
            (ctx,lex_ofigure,"ERROR: \'{\' not found after \'switch(...)\'");
  local_48.head = (SynSwitchCase *)0x0;
  local_48.tail = (SynSwitchCase *)0x0;
  do {
    pos = ctx->currentLexeme;
    if (pos->type == lex_default) {
      pLVar4 = pos;
      if (bVar1) {
        anon_unknown.dwarf_169315::Report(ctx,pos,"ERROR: default switch case is already defined");
        pLVar4 = ctx->currentLexeme;
        if (pLVar4->type != lex_none) goto LAB_0021b8d5;
      }
      else {
LAB_0021b8d5:
        ctx->currentLexeme = pLVar4 + 1;
      }
      bVar1 = true;
      this_00 = (SynBase *)0x0;
    }
    else {
      if (pos->type != lex_case) {
        anon_unknown.dwarf_169315::CheckConsume
                  (ctx,lex_cfigure,"ERROR: \'}\' not found after \'switch\' statement");
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
        pSVar2 = local_48.tail;
        pSVar5 = local_48.head;
        this_01 = (SynSwitch *)CONCAT44(extraout_var_02,iVar3);
        if (ctx->firstLexeme < ctx->currentLexeme) {
          SynBase::SynBase((SynBase *)this_01,0x2e,begin,ctx->currentLexeme + -1);
          (this_01->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e8028;
          this_01->condition = this;
          (this_01->cases).head = pSVar5;
          (this_01->cases).tail = pSVar2;
          return this_01;
        }
LAB_0021ba4c:
        __assert_fail("currentLexeme > firstLexeme",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                      ,0x19c,"Lexeme *ParseContext::Previous()");
      }
      ctx->currentLexeme = pos + 1;
      if (bVar1) {
        anon_unknown.dwarf_169315::Report
                  (ctx,pos + 1,"ERROR: default switch case can\'t be followed by more cases");
      }
      this_00 = ParseAssignment(ctx);
      if (this_00 == (SynBase *)0x0) {
        anon_unknown.dwarf_169315::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression expected after \'case\'");
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
        this_00 = (SynBase *)CONCAT44(extraout_var_00,iVar3);
        SynBase::SynBase(this_00,0,ctx->currentLexeme,ctx->currentLexeme);
        this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d30;
      }
    }
    anon_unknown.dwarf_169315::CheckConsume(ctx,lex_colon,"ERROR: \':\' expected");
    IVar6 = ParseExpressions(ctx);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    pSVar5 = (SynSwitchCase *)CONCAT44(extraout_var_01,iVar3);
    if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0021ba4c;
    SynBase::SynBase((SynBase *)pSVar5,0x2d,pos,ctx->currentLexeme + -1);
    (pSVar5->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e7ff0;
    pSVar5->value = this_00;
    pSVar5->expressions = IVar6;
    IntrusiveList<SynSwitchCase>::push_back(&local_48,pSVar5);
  } while( true );
}

Assistant:

SynSwitch* ParseSwitch(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_switch))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'switch'");

		SynBase *condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after 'switch('");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after expression in 'switch' statement");

		CheckConsume(ctx, lex_ofigure, "ERROR: '{' not found after 'switch(...)'");

		bool hadDefautltCase = false;

		IntrusiveList<SynSwitchCase> cases;

		while(ctx.At(lex_case) || ctx.At(lex_default))
		{
			Lexeme *pos = ctx.currentLexeme;

			SynBase *value = NULL;

			if(ctx.Consume(lex_case))
			{
				if(hadDefautltCase)
					Report(ctx, ctx.Current(), "ERROR: default switch case can't be followed by more cases");

				value = ParseAssignment(ctx);

				if(!value)
				{
					Report(ctx, ctx.Current(), "ERROR: expression expected after 'case'");

					value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
				}
			}
			else
			{
				if(hadDefautltCase)
					Report(ctx, ctx.Current(), "ERROR: default switch case is already defined");

				ctx.Skip();

				hadDefautltCase = true;
			}

			CheckConsume(ctx, lex_colon, "ERROR: ':' expected");

			IntrusiveList<SynBase> expressions = ParseExpressions(ctx);

			cases.push_back(new (ctx.get<SynSwitchCase>()) SynSwitchCase(pos, ctx.Previous(), value, expressions));
		}

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after 'switch' statement");

		return new (ctx.get<SynSwitch>()) SynSwitch(start, ctx.Previous(), condition, cases);
	}

	return NULL;
}